

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

void __thiscall
flatbuffers::GenerateRustModuleRootFile(flatbuffers::Parser_const&,std::__cxx11::string_const&)::
Module::Insert(flatbuffers::Namer_const&,flatbuffers::Definition_const__
          (void *this,Namer *namer,Definition *s)

{
  _Base_ptr *pp_Var1;
  _Link_type __k;
  undefined1 auVar2 [16];
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  byte extraout_var;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  _Link_type __p;
  pointer pbVar10;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar11;
  string ns_component;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Definition *local_40;
  Namer *local_38;
  
  pbVar10 = (s->defined_namespace->components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40 = s;
  local_38 = namer;
  if (pbVar10 !=
      (s->defined_namespace->components).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      (*local_38->_vptr_Namer[9])(&local_60,local_38,pbVar10);
      pp_Var1 = &((_Rb_tree_node_base *)this)->_M_parent;
      p_Var9 = (_Rb_tree_node_base *)pp_Var1;
      for (p_Var7 = ((_Rb_tree_node_base *)this)->_M_left; p_Var7 != (_Rb_tree_node_base *)0x0;
          p_Var7 = (&p_Var7->_M_left)[uVar5 >> 0x1f]) {
        uVar5 = std::__cxx11::string::compare((string *)(p_Var7 + 1));
        if (-1 < (int)uVar5) {
          p_Var9 = p_Var7;
        }
      }
      if ((p_Var9 == (_Rb_tree_node_base *)pp_Var1) ||
         (iVar6 = std::__cxx11::string::compare((string *)&local_60), iVar6 < 0)) {
        p_Var7 = (_Rb_tree_node_base *)operator_new(0x88);
        __k = (_Link_type)(p_Var7 + 1);
        *(_Base_ptr **)(p_Var7 + 1) = &p_Var7[1]._M_left;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__k,local_60._M_dataplus._M_p,
                   local_60._M_dataplus._M_p + local_60._M_string_length);
        p_Var7[2]._M_left = (_Base_ptr)0x0;
        p_Var7[2]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var7 + 3) = 0;
        p_Var7[3]._M_parent = (_Base_ptr)0x0;
        p_Var7[3]._M_left = (_Base_ptr)0x0;
        p_Var7[3]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var7 + 2) = 0;
        p_Var7[2]._M_parent = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var7 + 4) = 0;
        p_Var7[2]._M_right = (_Base_ptr)&p_Var7[2]._M_parent;
        *(_Base_ptr **)(p_Var7 + 3) = &p_Var7[2]._M_parent;
        p_Var7[3]._M_parent = (_Base_ptr)0x0;
        p_Var7[3]._M_left = (_Base_ptr)0x0;
        p_Var7[3]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var7 + 4) = 0;
        if (p_Var9 == (_Rb_tree_node_base *)pp_Var1) {
          if ((((_Rb_tree_node_base *)((long)this + 0x20))->_M_parent == (_Base_ptr)0x0) ||
             (__p = __k,
             iVar6 = std::__cxx11::string::compare((string *)(*(long *)((long)this + 0x20) + 0x20)),
             -1 < iVar6)) {
LAB_002aa9d4:
            __p = __k;
            pVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
                     ::_M_get_insert_unique_pos
                               ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
                                 *)this,(key_type *)__k);
          }
          else {
            p_Var8 = *(_Rb_tree_node_base **)((long)this + 0x20);
LAB_002aa9e5:
            auVar2._8_8_ = 0;
            auVar2._0_8_ = p_Var8;
            pVar11 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar2 << 0x40);
          }
        }
        else {
          __p = (_Link_type)(p_Var9 + 1);
          iVar6 = std::__cxx11::string::compare((string *)__k);
          if (iVar6 < 0) {
            p_Var8 = ((_Rb_tree_node_base *)this)->_M_right;
            pVar11.second = p_Var8;
            pVar11.first = p_Var8;
            if (p_Var8 != p_Var9) {
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var9);
              __p = __k;
              iVar6 = std::__cxx11::string::compare((string *)(p_Var8 + 1));
              if (-1 < iVar6) goto LAB_002aa9d4;
              p_Var3 = p_Var9;
              if (p_Var8->_M_right == (_Base_ptr)0x0) {
                p_Var9 = p_Var8;
                p_Var3 = (_Rb_tree_node_base *)0x0;
              }
              pVar11.second = p_Var9;
              pVar11.first = p_Var3;
            }
          }
          else {
            __p = __k;
            iVar6 = std::__cxx11::string::compare((string *)(p_Var9 + 1));
            if (iVar6 < 0) {
              p_Var8 = *(_Rb_tree_node_base **)((long)this + 0x20);
              if (p_Var8 == p_Var9) goto LAB_002aa9e5;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
              __p = (_Link_type)(p_Var8 + 1);
              iVar6 = std::__cxx11::string::compare((string *)__k);
              if (-1 < iVar6) goto LAB_002aa9d4;
              p_Var3 = p_Var8;
              if (p_Var9->_M_right == (_Base_ptr)0x0) {
                p_Var8 = p_Var9;
                p_Var3 = (_Rb_tree_node_base *)0x0;
              }
              pVar11.second = p_Var8;
              pVar11.first = p_Var3;
            }
            else {
              pVar11.second = (_Rb_tree_node_base *)0x0;
              pVar11.first = p_Var9;
            }
          }
        }
        p_Var8 = pVar11.second;
        p_Var9 = pVar11.first;
        if (p_Var8 == (_Rb_tree_node_base *)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Module>_>_>
                          *)p_Var7,__p);
        }
        else {
          bVar4 = true;
          if ((p_Var9 == (_Rb_tree_node_base *)0x0) && ((_Rb_tree_node_base *)pp_Var1 != p_Var8)) {
            std::__cxx11::string::compare((string *)__k);
            bVar4 = (bool)(extraout_var >> 7);
          }
          std::_Rb_tree_insert_and_rebalance(bVar4,p_Var7,p_Var8,(_Rb_tree_node_base *)pp_Var1);
          ((_Rb_tree_node_base *)((long)this + 0x20))->_M_parent =
               (_Base_ptr)
               ((long)&((_Rb_tree_node_base *)((long)this + 0x20))->_M_parent->_M_color + 1);
          p_Var9 = p_Var7;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      this = p_Var9 + 2;
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             (local_40->defined_namespace->components).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  (*local_38->_vptr_Namer[0xc])(&local_60,local_38,local_40,2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &((_Rb_tree_node_base *)((long)this + 0x20))->_M_left,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Insert(const Namer &namer, const Definition *s) {
      const Definition &symbol = *s;
      Module *current_module = this;
      for (auto it = symbol.defined_namespace->components.begin();
           it != symbol.defined_namespace->components.end(); it++) {
        std::string ns_component = namer.Namespace(*it);
        current_module = &current_module->sub_modules[ns_component];
      }
      current_module->generated_files.push_back(
          namer.File(symbol.name, SkipFile::Extension));
    }